

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O1

size_t sse4_despace_skinny_u2(char *bytes,size_t howmany)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar1 = _DAT_00198410;
  if (howmany < 0x20) {
    uVar5 = 0;
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    auVar7[8] = 0x21;
    auVar7._0_8_ = 0x2121212121212121;
    auVar7[9] = 0x21;
    auVar7[10] = 0x21;
    auVar7[0xb] = 0x21;
    auVar7[0xc] = 0x21;
    auVar7[0xd] = 0x21;
    auVar7[0xe] = 0x21;
    auVar7[0xf] = 0x21;
    uVar2 = 0;
    do {
      uVar5 = uVar2 + 0x20;
      auVar8 = *(undefined1 (*) [16])(bytes + uVar2 + 0x10);
      uVar6 = vpcmpub_avx512vl(*(undefined1 (*) [16])(bytes + uVar2),auVar7,1);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = thintable_epi8[uVar6 & 0xff];
      auVar9 = vmovhps_avx(auVar11,thintable_epi8[(uint)uVar6 >> 8]);
      auVar9 = vpaddb_avx(auVar9,auVar1);
      auVar9 = vpshufb_avx(*(undefined1 (*) [16])(bytes + uVar2),auVar9);
      auVar9 = vpshufb_avx(auVar9,*(undefined1 (*) [16])("" + (ulong)""[uVar6 & 0xff] * 8));
      *(undefined1 (*) [16])(bytes + sVar3) = auVar9;
      lVar4 = (0x10 - POPCOUNT((uint)uVar6)) + sVar3;
      uVar6 = vpcmpub_avx512vl(auVar8,auVar7,1);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = thintable_epi8[uVar6 & 0xff];
      auVar9 = vmovhps_avx(auVar9,thintable_epi8[(uint)uVar6 >> 8]);
      auVar9 = vpaddb_avx(auVar9,auVar1);
      auVar8 = vpshufb_avx(auVar8,auVar9);
      auVar8 = vpshufb_avx(auVar8,*(undefined1 (*) [16])("" + (ulong)""[uVar6 & 0xff] * 8));
      *(undefined1 (*) [16])(bytes + lVar4) = auVar8;
      sVar3 = (ulong)(0x10 - POPCOUNT((uint)uVar6)) + lVar4;
      uVar6 = uVar2 + 0x3f;
      uVar2 = uVar5;
    } while (uVar6 < howmany);
  }
  auVar1 = _DAT_00198410;
  if ((uVar5 | 0xf) < howmany) {
    auVar8[8] = 0x21;
    auVar8._0_8_ = 0x2121212121212121;
    auVar8[9] = 0x21;
    auVar8[10] = 0x21;
    auVar8[0xb] = 0x21;
    auVar8[0xc] = 0x21;
    auVar8[0xd] = 0x21;
    auVar8[0xe] = 0x21;
    auVar8[0xf] = 0x21;
    uVar2 = uVar5;
    do {
      uVar5 = uVar2 + 0x10;
      uVar6 = vpcmpub_avx512vl(*(undefined1 (*) [16])(bytes + uVar2),auVar8,1);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = thintable_epi8[uVar6 & 0xff];
      auVar7 = vmovhps_avx(auVar10,thintable_epi8[(uint)uVar6 >> 8]);
      auVar7 = vpaddb_avx(auVar7,auVar1);
      auVar7 = vpshufb_avx(*(undefined1 (*) [16])(bytes + uVar2),auVar7);
      auVar7 = vpshufb_avx(auVar7,*(undefined1 (*) [16])("" + (ulong)""[uVar6 & 0xff] * 8));
      *(undefined1 (*) [16])(bytes + sVar3) = auVar7;
      sVar3 = (0x10 - POPCOUNT((uint)uVar6)) + sVar3;
      uVar6 = uVar2 + 0x1f;
      uVar2 = uVar5;
    } while (uVar6 < howmany);
  }
  if (uVar5 < howmany) {
    do {
      if (' ' < bytes[uVar5]) {
        bytes[sVar3] = bytes[uVar5];
        sVar3 = sVar3 + 1;
      }
      uVar5 = uVar5 + 1;
    } while (howmany != uVar5);
  }
  return sVar3;
}

Assistant:

size_t sse4_despace_skinny_u2(char *bytes, size_t howmany) {
  size_t pos = 0;
  size_t i = 0;
  for (; i + 32 - 1 < howmany; i += 32) {
    __m128i x1 = _mm_loadu_si128((const __m128i *)(bytes + i));
    __m128i x2 = _mm_loadu_si128((const __m128i *)(bytes + i + 16));

    int mask16;
    x1 = skinnycleanm128(x1, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x1);
    pos += 16 - _mm_popcnt_u32(mask16);

    x2 = skinnycleanm128(x2, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x2);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i + 16 - 1 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16;
    x = skinnycleanm128(x, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if( (int) c <= 0x20) {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}